

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O0

float SoftMaxLoss(vector<float,_std::allocator<float>_> *output,Target classId,
                 vector<float,_std::allocator<float>_> *softMax,
                 vector<float,_std::allocator<float>_> *deltas,float *S)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  reference pfVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  vector<float,_std::allocator<float>_> *pvVar8;
  float extraout_XMM0_Da;
  double dVar9;
  float local_64;
  float local_60;
  int local_5c;
  float target;
  int neuronId;
  const_iterator cStack_50;
  float activation;
  const_iterator __end1;
  const_iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  float loss;
  float expSum;
  float *S_local;
  vector<float,_std::allocator<float>_> *deltas_local;
  vector<float,_std::allocator<float>_> *softMax_local;
  Target classId_local;
  vector<float,_std::allocator<float>_> *output_local;
  
  __range1._4_4_ = 0.0;
  __range1._0_4_ = 0.0;
  __end1 = std::vector<float,_std::allocator<float>_>::begin(output);
  cStack_50 = std::vector<float,_std::allocator<float>_>::end(output);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb0);
    if (!bVar3) break;
    pfVar4 = __gnu_cxx::
             __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1);
    neuronId = (int)*pfVar4;
    dVar9 = std::exp((double)(ulong)(uint)neuronId);
    target = SUB84(dVar9,0);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(softMax,&target);
    pvVar7 = std::vector<float,_std::allocator<float>_>::back(softMax);
    __range1._4_4_ = *pvVar7 + __range1._4_4_;
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&__end1);
  }
  local_5c = 0;
  while( true ) {
    uVar5 = (ulong)local_5c;
    pvVar8 = output;
    sVar6 = std::vector<float,_std::allocator<float>_>::size(output);
    if (sVar6 <= uVar5) break;
    std::abs((int)pvVar8);
    local_60 = (float)(-(uint)(extraout_XMM0_Da < 1e-05) & 0x3f800000);
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](softMax,(long)local_5c);
    *pvVar7 = *pvVar7 / __range1._4_4_;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](softMax,(long)local_5c);
    local_64 = *pvVar7 - local_60;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(deltas,&local_64);
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](softMax,(long)local_5c);
    fVar1 = *pvVar7;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](deltas,(long)local_5c);
    fVar2 = local_60;
    *S = fVar1 * *pvVar7 + *S;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](softMax,(long)local_5c);
    dVar9 = std::log((double)(ulong)(uint)*pvVar7);
    __range1._0_4_ = fVar2 * SUB84(dVar9,0) + __range1._0_4_;
    local_5c = local_5c + 1;
  }
  return -__range1._0_4_;
}

Assistant:

float SoftMaxLoss( const std::vector<float> &output, SPIKING_NN::Target classId,
                   std::vector<float> &softMax, std::vector<float> &deltas, float *S )
{
    float expSum = 0;
    float loss = 0;
    for ( auto activation: output ) {
        // TODO: make some exps on final target (important to understand everything around gradients formulas)
        softMax.emplace_back( exp( activation ));
        expSum += softMax.back();
    }
    for ( int neuronId = 0; neuronId < output.size(); neuronId++ ) {
        auto target = static_cast<float>( abs( classId - neuronId ) < SPIKING_NN::EPS );
        softMax[neuronId] /= expSum;
        deltas.emplace_back( softMax[neuronId] - target );
        *S += softMax[neuronId] * deltas[neuronId];
        loss += target * log( softMax[neuronId] );
    }
    return -loss;
}